

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_direct_response_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_direct_response_alert *this)

{
  undefined8 uVar1;
  stack_allocator *this_00;
  char *pcVar2;
  unsigned_long uVar3;
  char *local_4f8;
  allocator<char> local_4b0;
  byte local_4af;
  byte local_4ae;
  allocator local_4ad [17];
  int local_49c;
  string local_498 [32];
  address local_478;
  string local_458;
  char local_438 [8];
  char msg [1050];
  dht_direct_response_alert *this_local;
  
  unique0x100001c4 = this;
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
            (&local_478,&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>);
  boost::asio::ip::address::to_string_abi_cxx11_(&local_458,&local_478);
  uVar1 = ::std::__cxx11::string::c_str();
  local_4ae = 0;
  local_4af = 0;
  if (this->m_response_size == 0) {
    local_4f8 = "";
  }
  else {
    this_00 = ::std::reference_wrapper<libtorrent::aux::stack_allocator>::get(&this->m_alloc);
    local_49c = (this->m_response_idx).m_idx;
    pcVar2 = libtorrent::aux::stack_allocator::ptr(this_00,(allocation_slot)local_49c);
    uVar3 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(this->m_response_size);
    ::std::allocator<char>::allocator();
    local_4ae = 1;
    ::std::__cxx11::string::string(local_498,pcVar2,uVar3,local_4ad);
    local_4af = 1;
    local_4f8 = (char *)::std::__cxx11::string::c_str();
  }
  snprintf(local_438,0x41a,"DHT direct response (address=%s) [ %s ]",uVar1,local_4f8);
  if ((local_4af & 1) != 0) {
    ::std::__cxx11::string::~string(local_498);
  }
  if ((local_4ae & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)local_4ad);
  }
  ::std::__cxx11::string::~string((string *)&local_458);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_438,&local_4b0);
  ::std::allocator<char>::~allocator(&local_4b0);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_direct_response_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[1050];
		std::snprintf(msg, sizeof(msg), "DHT direct response (address=%s) [ %s ]"
			, endpoint.address().to_string().c_str()
			, m_response_size ? std::string(m_alloc.get().ptr(m_response_idx)
				, aux::numeric_cast<std::size_t>(m_response_size)).c_str() : "");
		return msg;
#endif
	}